

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_sse2::c_imm_v64_shl_n_16<1>(c_v64 a)

{
  c_v64 cVar1;
  
  cVar1.u16[1] = a.u16[1] * 2;
  cVar1.u16[0] = a.u16[0] * 2;
  cVar1.u16[2] = a.u16[2] * 2;
  cVar1.u16[3] = a.u16[3] * 2;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = (uint16_t)(a.u16[c] << n);
  return t;
}